

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawShaderDrawParametersTests.cpp
# Opt level: O1

void vkt::Draw::anon_unknown_0::addDrawCase(TestCaseGroup *group,TestSpec *testSpec,TestFlags flags)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  TestContext *testCtx;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  *p_Var3;
  TestNode *node;
  ostringstream name;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  _Stack_258;
  VkPrimitiveTopology local_228;
  uint local_224;
  long *local_220 [2];
  long local_210 [2];
  long *local_200;
  long local_1f0 [2];
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_1e0;
  VkPrimitiveTopology local_1b0;
  uint local_1ac;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"draw",4);
  if ((flags & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_indexed",8);
  }
  if ((flags & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_indirect",9);
  }
  if ((flags & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_instanced",10);
  }
  if ((flags & 0x10) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_first_instance",0xf);
  }
  node = (TestNode *)operator_new(0xa8);
  testCtx = (group->super_TestNode).m_testCtx;
  std::__cxx11::stringbuf::str();
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"");
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_1e0,
             (_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)testSpec);
  local_228 = (testSpec->super_TestSpecBase).topology;
  local_224 = flags | *(uint *)&(testSpec->super_TestSpecBase).field_0x34;
  p_Var1 = &_Stack_258._M_impl.super__Rb_tree_header;
  if (local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    p_Var3 = &_Stack_258;
    _Stack_258._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_258._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_258._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_258._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  else {
    p_Var2 = &local_1e0._M_impl.super__Rb_tree_header;
    _Stack_258._M_impl.super__Rb_tree_header._M_header._M_color =
         local_1e0._M_impl.super__Rb_tree_header._M_header._M_color;
    _Stack_258._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent;
    _Stack_258._M_impl.super__Rb_tree_header._M_header._M_left =
         local_1e0._M_impl.super__Rb_tree_header._M_header._M_left;
    _Stack_258._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    p_Var3 = &local_1e0;
    _Stack_258._M_impl.super__Rb_tree_header._M_node_count =
         local_1e0._M_impl.super__Rb_tree_header._M_node_count;
    local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_1e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  (p_Var3->_M_impl).super__Rb_tree_header._M_node_count = 0;
  local_1b0 = local_228;
  local_1ac = local_224;
  tcu::TestCase::TestCase((TestCase *)node,testCtx,(char *)local_200,(char *)local_220[0]);
  node->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory_00d2b508;
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)(node + 1),&_Stack_258);
  *(VkPrimitiveTopology *)&node[1].m_description._M_dataplus._M_p = local_228;
  *(uint *)((long)&node[1].m_description._M_dataplus._M_p + 4) = local_224;
  tcu::TestNode::addChild(&group->super_TestNode,node);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&_Stack_258);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&local_1e0);
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void addDrawCase (tcu::TestCaseGroup* group, const DrawTest::TestSpec testSpec, const TestFlags flags)
{
	std::ostringstream name;
	name << "draw";

	if (flags & TEST_FLAG_INDEXED)			name << "_indexed";
	if (flags & TEST_FLAG_INDIRECT)			name << "_indirect";
	if (flags & TEST_FLAG_INSTANCED)		name << "_instanced";
	if (flags & TEST_FLAG_FIRST_INSTANCE)	name << "_first_instance";

	group->addChild(new InstanceFactory<DrawTest>(group->getTestContext(), name.str(), "", addFlags(testSpec, flags)));
}